

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opensketch.h
# Opt level: O2

void __thiscall OpenSketch<4U>::heap_up(OpenSketch<4U> *this,int i)

{
  mapped_type mVar1;
  KV<4U> *pKVar2;
  KV<4U> KVar3;
  bool bVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  uint uVar7;
  
  while( true ) {
    if (i < 2) {
      return;
    }
    uVar7 = i - 1U >> 1;
    bVar4 = std::operator<=(this->heap + uVar7,this->heap + (uint)i);
    if (bVar4) break;
    pKVar2 = this->heap;
    KVar3 = pKVar2[(uint)i];
    pKVar2[(uint)i] = pKVar2[uVar7];
    pKVar2[uVar7] = KVar3;
    pmVar5 = std::__detail::
             _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->mp,&this->heap[(uint)i].second);
    pmVar6 = std::__detail::
             _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->mp,&this->heap[uVar7].second);
    mVar1 = *pmVar5;
    *pmVar5 = *pmVar6;
    *pmVar6 = mVar1;
    i = uVar7;
  }
  return;
}

Assistant:

void heap_up(int i) {
		while (i > 1) {
			int parent = (i - 1) / 2;
			if (heap[parent] <= heap[i]) {
				break;
			}
			swap(heap[i], heap[parent]);
			swap(mp[heap[i].second], mp[heap[parent].second]);
			i = parent;
		}
	}